

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfFormatter<wchar_t>::format
          (PrintfFormatter<wchar_t> *this,BasicWriter<wchar_t> *writer,
          PrintfFormatter<wchar_t> *param_3)

{
  bool bVar1;
  uint arg_index_00;
  wchar_t *pwVar2;
  FormatError *this_00;
  wchar_t *end;
  bool local_161;
  PrintfArgFormatter<wchar_t> local_150;
  CharConverter local_140 [3];
  CStringRef local_128;
  ArgConverter<int> local_120;
  ArgConverter<long> local_110;
  ArgConverter<unsigned_long> local_100;
  ArgConverter<long> local_f0;
  ArgConverter<long> local_e0;
  ArgConverter<long_long> local_d0;
  ArgConverter<short> local_c0;
  ArgConverter<signed_char> local_b0;
  ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool> local_99;
  undefined1 local_98 [8];
  Arg arg;
  ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> local_51;
  uint local_50;
  undefined1 local_4c [4];
  uint arg_index;
  FormatSpec spec;
  wchar_t c;
  wchar_t *s;
  wchar_t *start;
  BasicWriter<wchar_t> *writer_local;
  PrintfFormatter<wchar_t> *this_local;
  BasicCStringRef<wchar_t> format_str_local;
  
  this_local = param_3;
  s = BasicCStringRef<wchar_t>::c_str((BasicCStringRef<wchar_t> *)&this_local);
  unique0x100005ac = s;
  while( true ) {
    while( true ) {
      do {
        pwVar2 = stack0xffffffffffffffd0;
        if (*stack0xffffffffffffffd0 == L'\0') {
          FormatterBase::write<wchar_t>((FormatterBase *)this,writer,s,stack0xffffffffffffffd0);
          return;
        }
        end = stack0xffffffffffffffd0 + 1;
        spec.precision_ = *stack0xffffffffffffffd0;
        unique0x100005c4 = end;
      } while (spec.precision_ != L'%');
      if (*end != L'%') break;
      FormatterBase::write<wchar_t>((FormatterBase *)this,writer,s,end);
      s = stack0xffffffffffffffd0 + 1;
      unique0x100005b4 = s;
    }
    FormatterBase::write<wchar_t>((FormatterBase *)this,writer,s,pwVar2);
    FormatSpec::FormatSpec((FormatSpec *)local_4c,0,'\0',L' ');
    spec.super_AlignSpec.super_WidthSpec.width_ = 2;
    local_50 = parse_header(this,(wchar_t **)&spec.type_,(FormatSpec *)local_4c);
    pwVar2 = stack0xffffffffffffffd0;
    if (*stack0xffffffffffffffd0 == L'.') {
      pwVar2 = stack0xffffffffffffffd0 + 1;
      if ((*pwVar2 < L'0') || (L'9' < *pwVar2)) {
        if (*pwVar2 == L'*') {
          pwVar2 = stack0xffffffffffffffd0 + 2;
          unique0x1000053c = pwVar2;
          arg_index_00 = std::numeric_limits<unsigned_int>::max();
          get_arg((Arg *)&arg.field_0x18,this,pwVar2,arg_index_00);
          spec.super_AlignSpec.align_ =
               ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
                         (&local_51,(Arg *)&arg.field_0x18);
          pwVar2 = stack0xffffffffffffffd0;
        }
      }
      else {
        unique0x10000544 = pwVar2;
        spec.super_AlignSpec.align_ =
             anon_unknown_1::parse_nonnegative_int<wchar_t>((wchar_t **)&spec.type_);
        pwVar2 = stack0xffffffffffffffd0;
      }
    }
    stack0xffffffffffffffd0 = pwVar2;
    get_arg((Arg *)local_98,this,stack0xffffffffffffffd0,local_50);
    bVar1 = FormatSpec::flag((FormatSpec *)local_4c,8);
    local_161 = false;
    if (bVar1) {
      local_161 = ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool>::visit
                            (&local_99,(Arg *)local_98);
    }
    if (local_161 != false) {
      spec.super_AlignSpec.super_WidthSpec.fill_ =
           spec.super_AlignSpec.super_WidthSpec.fill_ & 0xfffffff7;
    }
    if (arg_index == 0x30) {
      if ((int)arg.super_Value.field_0._8_4_ < 10) {
        spec.super_AlignSpec.super_WidthSpec.width_ = 4;
      }
      else {
        arg_index = 0x20;
      }
    }
    pwVar2 = stack0xffffffffffffffd0 + 1;
    switch(*stack0xffffffffffffffd0) {
    case L'L':
      unique0x100005ec = pwVar2;
      break;
    default:
      anon_unknown_1::ArgConverter<int>::ArgConverter
                (&local_120,(Arg *)local_98,*stack0xffffffffffffffd0);
      ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<int>,_void>::visit
                ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<int>,_void> *)&local_120,
                 (Arg *)local_98);
      break;
    case L'h':
      if (*pwVar2 == L'h') {
        pwVar2 = stack0xffffffffffffffd0 + 2;
        unique0x1000057c = stack0xffffffffffffffd0 + 2;
        anon_unknown_1::ArgConverter<signed_char>::ArgConverter(&local_b0,(Arg *)local_98,*pwVar2);
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void> *)
                   &local_b0,(Arg *)local_98);
      }
      else {
        unique0x10000574 = pwVar2;
        anon_unknown_1::ArgConverter<short>::ArgConverter(&local_c0,(Arg *)local_98,*pwVar2);
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *)&local_c0,
                   (Arg *)local_98);
      }
      break;
    case L'j':
      unique0x1000056c = pwVar2;
      anon_unknown_1::ArgConverter<long>::ArgConverter(&local_f0,(Arg *)local_98,*pwVar2);
      ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_f0,
                 (Arg *)local_98);
      break;
    case L'l':
      if (*pwVar2 == L'l') {
        pwVar2 = stack0xffffffffffffffd0 + 2;
        unique0x10000564 = stack0xffffffffffffffd0 + 2;
        anon_unknown_1::ArgConverter<long_long>::ArgConverter(&local_d0,(Arg *)local_98,*pwVar2);
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void> *)
                   &local_d0,(Arg *)local_98);
      }
      else {
        unique0x1000055c = pwVar2;
        anon_unknown_1::ArgConverter<long>::ArgConverter(&local_e0,(Arg *)local_98,*pwVar2);
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_e0,
                   (Arg *)local_98);
      }
      break;
    case L't':
      unique0x10000554 = pwVar2;
      anon_unknown_1::ArgConverter<long>::ArgConverter(&local_110,(Arg *)local_98,*pwVar2);
      ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_110,
                 (Arg *)local_98);
      break;
    case L'z':
      unique0x1000054c = pwVar2;
      anon_unknown_1::ArgConverter<unsigned_long>::ArgConverter(&local_100,(Arg *)local_98,*pwVar2);
      ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void>::visit
                ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void> *)
                 &local_100,(Arg *)local_98);
    }
    if (*stack0xffffffffffffffd0 == L'\0') break;
    pwVar2 = stack0xffffffffffffffd0 + 1;
    spec.flags_._0_1_ = (char)*stack0xffffffffffffffd0;
    unique0x10000594 = pwVar2;
    if ((int)arg.super_Value.field_0.string.size._0_4_ < 8) {
      if ((char)spec.flags_ == 'c') {
        anon_unknown_1::CharConverter::CharConverter(local_140,(Arg *)local_98);
        ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)local_140,
                   (Arg *)local_98);
      }
      else if (((char)spec.flags_ == 'i') || ((char)spec.flags_ == 'u')) {
        spec.flags_._0_1_ = 'd';
      }
    }
    s = stack0xffffffffffffffd0;
    PrintfArgFormatter<wchar_t>::PrintfArgFormatter(&local_150,writer,(FormatSpec *)local_4c);
    ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void>::visit
              ((ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void> *)&local_150,
               (Arg *)local_98);
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(&local_128,"invalid format string");
  FormatError::FormatError(this_00,local_128);
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::format(
    BasicWriter<Char> &writer, BasicCStringRef<Char> format_str) {
  const Char *start = format_str.c_str();
  const Char *s = start;
  while (*s) {
    Char c = *s++;
    if (c != '%') continue;
    if (*s == c) {
      write(writer, start, s);
      start = ++s;
      continue;
    }
    write(writer, start, s - 1);

    FormatSpec spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(s, spec);

    // Parse precision.
    if (*s == '.') {
      ++s;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = parse_nonnegative_int(s);
      } else if (*s == '*') {
        ++s;
        spec.precision_ = PrecisionHandler().visit(get_arg(s));
      }
    }

    Arg arg = get_arg(s, arg_index);
    if (spec.flag(HASH_FLAG) && IsZeroInt().visit(arg))
      spec.flags_ &= ~HASH_FLAG;
    if (spec.fill_ == '0') {
      if (arg.type <= Arg::LAST_NUMERIC_TYPE)
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    switch (*s++) {
    case 'h':
      if (*s == 'h')
        ArgConverter<signed char>(arg, *++s).visit(arg);
      else
        ArgConverter<short>(arg, *s).visit(arg);
      break;
    case 'l':
      if (*s == 'l')
        ArgConverter<fmt::LongLong>(arg, *++s).visit(arg);
      else
        ArgConverter<long>(arg, *s).visit(arg);
      break;
    case 'j':
      ArgConverter<intmax_t>(arg, *s).visit(arg);
      break;
    case 'z':
      ArgConverter<std::size_t>(arg, *s).visit(arg);
      break;
    case 't':
      ArgConverter<std::ptrdiff_t>(arg, *s).visit(arg);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --s;
      ArgConverter<int>(arg, *s).visit(arg);
    }

    // Parse type.
    if (!*s)
      FMT_THROW(FormatError("invalid format string"));
    spec.type_ = static_cast<char>(*s++);
    if (arg.type <= Arg::LAST_INTEGER_TYPE) {
      // Normalize type.
      switch (spec.type_) {
      case 'i': case 'u':
        spec.type_ = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t
        CharConverter(arg).visit(arg);
        break;
      }
    }

    start = s;

    // Format argument.
    internal::PrintfArgFormatter<Char>(writer, spec).visit(arg);
  }
  write(writer, start, s);
}